

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O1

ostream * license::operator<<(ostream *out,EventRegistry *er)

{
  pointer_conflict paVar1;
  ostream *poVar2;
  size_t sVar3;
  anon_struct_1288_4_4db92441 *it;
  pointer_conflict paVar4;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EventReg[step:","");
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_50,local_48);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,er->current_validation_step);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",events:{",9);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  paVar1 = (er->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar4 = (er->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                super__Vector_impl_data._M_start; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"[ev:",4);
    poVar2 = (ostream *)std::ostream::operator<<(out,paVar4->event_type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",sev:",5);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar4->severity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ref:",4);
    sVar3 = strlen(paVar4->license_reference);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,paVar4->license_reference,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

ostream &operator<<(std::ostream &out, const EventRegistry &er) {
	out << string("EventReg[step:") << er.current_validation_step << ",events:{";
	for (auto &it : er.logs) {
		out << "[ev:" << it.event_type << ",sev:" << it.severity << "ref:" << it.license_reference << "]";
	}
	out << "]";
	return out;
}